

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeHolder::newLabelEntry(CodeHolder *this,LabelEntry **entryOut)

{
  ZoneAllocator *allocator;
  size_type *psVar1;
  byte bVar2;
  char cVar3;
  size_type sVar4;
  uint uVar5;
  DynamicBlock *pDVar6;
  Value VVar7;
  CodeHolder *pCVar8;
  bool bVar9;
  undefined1 uVar10;
  Error EVar11;
  int iVar12;
  LabelEntry *pLVar13;
  ZoneHashNode *node;
  DynamicBlock *pDVar14;
  DynamicBlock *pDVar15;
  DynamicBlock *pDVar16;
  ulong uVar17;
  DynamicBlock *pDVar18;
  AddressTableEntry *pAVar19;
  uint extraout_EDX;
  uint extraout_EDX_00;
  char *name;
  long lVar20;
  uint64_t *out;
  undefined8 *puVar21;
  Slot *pSVar22;
  Slot *pSVar23;
  ulong uVar24;
  anon_union_8_2_185e79b9_for_Zone_4 aVar25;
  undefined8 *puVar26;
  Value zone;
  Value VVar27;
  Value VVar28;
  ZoneAllocator *allocator_00;
  void *pvVar29;
  CodeHolder *self;
  uint uVar30;
  undefined8 in_R8;
  long lVar31;
  ulong in_R9;
  CodeHolder *pCVar32;
  DynamicBlock *pDVar33;
  Value VVar34;
  Slot *pSVar35;
  ulong *puVar36;
  DynamicBlock *pDVar37;
  Value allocator_01;
  bool bVar38;
  ulong auStack_230 [2];
  Value VStack_220;
  ulong uStack_218;
  Slot *pSStack_210;
  Value VStack_208;
  Value VStack_200;
  ulong uStack_1f8;
  CodeHolder *pCStack_1f0;
  Value VStack_1e8;
  Slot *pSStack_1e0;
  CodeHolder *pCStack_1d0;
  Error EStack_1c4;
  Slot *pSStack_1c0;
  Slot *pSStack_1b8;
  Slot *pSStack_1b0;
  CodeHolder *pCStack_1a8;
  Slot *pSStack_1a0;
  Value *pVStack_198;
  Value VStack_190;
  Value VStack_188;
  Slot *pSStack_180;
  DynamicBlock *pDStack_178;
  Value VStack_170;
  ulong uStack_168;
  undefined8 uStack_160;
  size_t sStack_150;
  DynamicBlock *pDStack_148;
  DynamicBlock *pDStack_140;
  DynamicBlock *pDStack_138;
  DynamicBlock *pDStack_130;
  ulong uStack_128;
  Error EStack_114;
  DynamicBlock *pDStack_110;
  DynamicBlock *pDStack_108;
  DynamicBlock *pDStack_100;
  Slot *pSStack_f8;
  ZoneAllocator *pZStack_f0;
  DynamicBlock *pDStack_e8;
  Slot *pSStack_e0;
  DynamicBlock **ppDStack_d8;
  DynamicBlock *pDStack_d0;
  DynamicBlock *pDStack_c8;
  ZoneHashNode *pZStack_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  ZoneAllocator *pZStack_a8;
  Slot *pSStack_98;
  uint uStack_84;
  undefined8 uStack_80;
  ZoneAllocator *pZStack_78;
  undefined8 *puStack_70;
  ulong uStack_68;
  size_t sStack_60;
  LabelEntry **ppLStack_58;
  size_t sStack_28;
  
  *entryOut = (LabelEntry *)0x0;
  sVar4 = (this->_labelEntries).super_ZoneVectorBase._size;
  if (sVar4 == 0xffffffff) {
    EVar11 = 0xd;
  }
  else {
    allocator_00 = &this->_allocator;
    if (((this->_labelEntries).super_ZoneVectorBase._capacity != sVar4) ||
       (EVar11 = ZoneVectorBase::_grow(&(this->_labelEntries).super_ZoneVectorBase,allocator_00,8,1)
       , EVar11 == 0)) {
      if (allocator_00->_zone == (Zone *)0x0) {
        newLabelEntry();
      }
      else {
        puVar26 = (undefined8 *)0x40;
        pLVar13 = (LabelEntry *)ZoneAllocator::_allocZeroed(allocator_00,0x40,&sStack_28);
        if (pLVar13 != (LabelEntry *)0x0) {
          *(size_type *)&pLVar13->field_0xc = sVar4;
          pLVar13->_parentId = 0xffffffff;
          pLVar13->_offset = 0;
          uVar30 = (this->_labelEntries).super_ZoneVectorBase._size;
          uVar17 = (ulong)uVar30;
          if (uVar30 < (this->_labelEntries).super_ZoneVectorBase._capacity) {
            *(LabelEntry **)((long)(this->_labelEntries).super_ZoneVectorBase._data + uVar17 * 8) =
                 pLVar13;
            psVar1 = &(this->_labelEntries).super_ZoneVectorBase._size;
            *psVar1 = *psVar1 + 1;
            *entryOut = pLVar13;
            return 0;
          }
          newLabelEntry();
          pSVar22 = (Slot *)(in_R9 & 0xffffffff);
          *puVar26 = 0;
          pSStack_98 = (Slot *)0x11425b;
          uStack_80 = in_R8;
          uStack_68 = uVar17;
          ppLStack_58 = entryOut;
          uStack_84 = CodeHolder_hashNameAndGetSize(name,&uStack_68);
          uVar17 = uStack_68;
          if (uStack_68 == 0) {
            EVar11 = 0x11;
          }
          else if (uStack_68 < 0x801) {
            uVar30 = (uint)in_R9;
            if ((int)uStack_80 - 2U < 2) {
              if (uVar30 != 0xffffffff) {
                return 0x13;
              }
            }
            else {
              if ((int)uStack_80 != 1) {
                return 2;
              }
              if (*(uint *)((long)(allocator_00 + 2) + 0x18) <= uVar30) {
                return 0x12;
              }
              uStack_84 = uStack_84 ^ uVar30;
            }
            for (puVar21 = *(undefined8 **)
                            (*(long *)((long)(allocator_00 + 2) + 0x30) +
                            (ulong)(uStack_84 -
                                   (int)((ulong)*(uint *)((long)(allocator_00 + 2) + 0x48) *
                                         (ulong)uStack_84 >>
                                        (*(byte *)((long)(allocator_00 + 2) + 0x4c) & 0x3f)) *
                                   *(int *)((long)(allocator_00 + 2) + 0x40)) * 8);
                puVar21 != (undefined8 *)0x0; puVar21 = (undefined8 *)*puVar21) {
              if ((*(int *)(puVar21 + 6) == (int)uVar17) &&
                 (*(uint *)((long)puVar21 + 0x14) == uVar30)) {
                if (uVar17 < 0xc) {
                  pvVar29 = (void *)((long)puVar21 + 0x34);
                }
                else {
                  pvVar29 = (void *)puVar21[7];
                }
                pSStack_98 = (Slot *)0x11430e;
                iVar12 = bcmp(pvVar29,name,uVar17);
                if (iVar12 == 0) {
                  return 0xf;
                }
              }
            }
            uVar5 = *(uint *)((long)(allocator_00 + 2) + 0x18);
            if (uVar5 == 0xffffffff) {
              EVar11 = 0xd;
            }
            else {
              allocator = (ZoneAllocator *)(allocator_00->_slots + 7);
              puStack_70 = puVar26;
              if (*(uint *)((long)(allocator_00 + 2) + 0x1c) == uVar5) {
                pSStack_98 = (Slot *)0x114357;
                EVar11 = ZoneVectorBase::_grow
                                   ((ZoneVectorBase *)((long)(allocator_00 + 2) + 0x10),allocator,8,
                                    1);
                if (EVar11 != 0) {
                  return EVar11;
                }
              }
              if (allocator->_zone == (Zone *)0x0) {
                pSStack_98 = (Slot *)0x114439;
                newNamedLabelEntry();
              }
              else {
                pSStack_98 = (Slot *)0x114380;
                pZStack_78 = allocator;
                node = (ZoneHashNode *)ZoneAllocator::_allocZeroed(allocator,0x40,&sStack_60);
                if (node != (ZoneHashNode *)0x0) {
                  *(uint *)&node[8].field_0x0 = uStack_84;
                  *(uint *)(node + 0xc) = uVar5;
                  node[0x10].field_0x0 = (undefined1)uStack_80;
                  *(uint *)(node + 0x14) = uVar30;
                  *(undefined8 *)&node[0x18].field_0x0 = 0;
                  pDVar15 = (DynamicBlock *)(node + 0x30);
                  zone.expression = (Expression *)(allocator_00->_slots + 3);
                  pSStack_98 = (Slot *)0x1143c5;
                  EVar11 = ZoneStringBase::setData
                                     ((ZoneStringBase *)pDVar15,(Zone *)zone.expression,0xb,name,
                                      uVar17);
                  if (EVar11 != 0) {
                    return EVar11;
                  }
                  if (*(uint *)((long)(allocator_00 + 2) + 0x18) <
                      *(uint *)((long)(allocator_00 + 2) + 0x1c)) {
                    *(ZoneHashNode **)
                     &(*(ZoneHashNode **)((long)(allocator_00 + 2) + 0x10))
                      [(ulong)*(uint *)((long)(allocator_00 + 2) + 0x18) * 8].field_0x0 = node;
                    *(int *)((long)(allocator_00 + 2) + 0x18) =
                         *(int *)((long)(allocator_00 + 2) + 0x18) + 1;
                    pSStack_98 = (Slot *)0x1143ff;
                    ZoneHashBase::_insert
                              ((ZoneHashBase *)((long)(allocator_00 + 2) + 0x30),pZStack_78,node);
                    *puStack_70 = node;
                    return 0;
                  }
                  pSStack_98 = (Slot *)resolveUnresolvedLinks;
                  newNamedLabelEntry();
                  uStack_b0 = uVar17;
                  pSVar35 = (Slot *)0x0;
                  if ((pDVar15[0x11].next != (DynamicBlock *)0x0) &&
                     ((ulong)*(uint *)&pDVar15[0xd].next != 0)) {
                    pDStack_d0 = pDVar15[0xd].prev;
                    ppDStack_d8 = &pDStack_d0->prev + *(uint *)&pDVar15[0xd].next;
                    pSVar35 = (Slot *)0x0;
                    pDVar16 = pDVar15;
                    pZStack_c0 = node;
                    uStack_b8 = (ulong)uVar5;
                    pZStack_a8 = allocator_00;
                    pSStack_98 = pSVar22;
                    do {
                      pDVar37 = pDStack_d0->prev;
                      if ((pDVar37[2].prev != (DynamicBlock *)0x0) &&
                         (pDVar37[2].next != (DynamicBlock *)0x0)) {
                        pDVar33 = (DynamicBlock *)&pDVar37[2].next;
                        pDVar18 = pDVar37[2].prev[1].prev;
                        bVar38 = CARRY8((ulong)pDVar18,(ulong)pDVar37[1].next);
                        pDVar18 = (DynamicBlock *)((long)&(pDVar37[1].next)->prev + (long)pDVar18);
                        allocator_00 = (ZoneAllocator *)
                                       CONCAT71((int7)((ulong)allocator_00 >> 8),bVar38);
                        pDVar37 = pDVar37[2].next;
                        pDStack_c8 = pDVar18;
                        do {
                          pSVar23 = pSVar35;
                          if (*(int *)((long)&pDVar37->next + 4) != -1) goto LAB_00114563;
                          if (*(uint *)&pDVar15[0xb].next <= *(uint *)&pDVar37->next) {
                            pSStack_e0 = (Slot *)0x1145a2;
                            resolveUnresolvedLinks();
LAB_001145a2:
                            pSStack_e0 = (Slot *)0x1145a7;
                            resolveUnresolvedLinks();
LAB_001145a7:
                            pSStack_e0 = (Slot *)0x1145ac;
                            resolveUnresolvedLinks();
LAB_001145ac:
                            pSStack_e0 = (Slot *)0x1145b1;
                            resolveUnresolvedLinks();
                            EStack_114 = 0xc;
                            if (*(uint *)&pDVar16[0xd].next <=
                                *(uint *)((zone.expression)->reserved + 1)) {
                              return 0xc;
                            }
                            pDVar14 = (&(pDVar16[0xd].prev)->prev)
                                      [*(uint *)((zone.expression)->reserved + 1)];
                            if (pDVar14 == (DynamicBlock *)0x0) {
                              return 0xc;
                            }
                            uVar17 = (ulong)extraout_EDX;
                            if (*(uint *)&pDVar16[0xb].next < extraout_EDX) {
                              return 0x14;
                            }
                            if (pDVar14[2].prev != (DynamicBlock *)0x0) {
                              return 0xe;
                            }
                            pDStack_108 = pDVar15;
                            pDStack_100 = pDVar33;
                            pSStack_f8 = pSVar35;
                            pZStack_f0 = allocator_00;
                            pDStack_e8 = pDVar37;
                            pSStack_e0 = pSVar22;
                            if (extraout_EDX < *(uint *)&pDVar16[0xb].next) {
                              pDStack_110 = (&(pDVar16[0xb].prev)->prev)[uVar17];
                              pDVar14[2].prev = pDStack_110;
                              pDVar14[1].next = pDVar18;
                              if (pDVar14[2].next == (DynamicBlock *)0x0) {
                                return 0;
                              }
                              EStack_114 = 0;
                              pDVar15 = pDVar14[2].next;
                              pDVar37 = (DynamicBlock *)&pDVar14[2].next;
                              goto LAB_0011464e;
                            }
                            uStack_128 = 0x11474d;
                            pDVar15 = pDVar16;
                            bindLabel();
                            uVar24 = (ulong)extraout_EDX_00;
                            allocator_01.expression = (Expression *)(pDVar15 + 4);
                            uVar30 = *(uint *)&pDVar15[0xe].next;
                            pDStack_148 = pDVar18;
                            pDStack_140 = pDVar33;
                            pDStack_138 = pDVar16;
                            pDStack_130 = pDVar14;
                            uStack_128 = uVar17;
                            if (*(uint *)((long)&pDVar15[0xe].next + 4) == uVar30) {
                              uStack_160 = 0x11478f;
                              EVar11 = ZoneVectorBase::_grow
                                                 ((ZoneVectorBase *)(pDVar15 + 0xe),
                                                  (ZoneAllocator *)allocator_01.expression,8,1);
                              if (EVar11 != 0) {
                                return EVar11;
                              }
                              uVar30 = *(uint *)&pDVar15[0xe].next;
                            }
                            VVar34.constant._4_4_ = 0;
                            VVar34.constant._0_4_ = uVar30;
                            if (uVar30 == 0xffffffff) {
                              EVar11 = 0x17;
                            }
                            else {
                              lVar20._0_1_ = *(uint8_t *)allocator_01;
                              lVar20._1_1_ = ((uint8_t *)((long)allocator_01 + 1))[0];
                              lVar20._2_1_ = ((uint8_t *)((long)allocator_01 + 1))[1];
                              lVar20._3_1_ = ((uint8_t *)((long)allocator_01 + 3))[0];
                              lVar20._4_1_ = ((uint8_t *)((long)allocator_01 + 3))[1];
                              lVar20._5_1_ = ((uint8_t *)((long)allocator_01 + 3))[2];
                              lVar20._6_1_ = ((uint8_t *)((long)allocator_01 + 3))[3];
                              lVar20._7_1_ = ((uint8_t *)((long)allocator_01 + 3))[4];
                              if (lVar20 == 0) {
                                uStack_160 = 0x11480f;
                                newRelocEntry();
                              }
                              else {
                                uStack_160 = 0x1147b8;
                                VVar28.expression = allocator_01.expression;
                                pDVar16 = (DynamicBlock *)
                                          ZoneAllocator::_allocZeroed
                                                    ((ZoneAllocator *)allocator_01.expression,0x28,
                                                     &sStack_150);
                                if (pDVar16 != (DynamicBlock *)0x0) {
                                  *(uint *)&pDVar16->prev = uVar30;
                                  *(uint *)((long)&pDVar16->prev + 4) = extraout_EDX_00 & 0xff;
                                  pDVar16[1].prev = (DynamicBlock *)0xffffffffffffffff;
                                  if (*(uint *)&pDVar15[0xe].next <
                                      *(uint *)((long)&pDVar15[0xe].next + 4)) {
                                    (&(pDVar15[0xe].prev)->prev)[*(uint *)&pDVar15[0xe].next] =
                                         pDVar16;
                                    *(int *)&pDVar15[0xe].next = *(int *)&pDVar15[0xe].next + 1;
                                    *(DynamicBlock **)zone.expression = pDVar16;
                                    return 0;
                                  }
                                  uStack_160 = 0x11481b;
                                  newRelocEntry();
                                  if ((ulong)*(uint *)(VVar28.constant + 200) == 0) {
                                    return 0;
                                  }
                                  lVar20 = 0;
                                  self = (CodeHolder *)0x0;
                                  VVar27.constant = 0;
                                  goto LAB_00114839;
                                }
                              }
                              EVar11 = 1;
                            }
                            return EVar11;
                          }
                          pDVar18 = pDVar15[0xb].prev;
                          pDVar14 = (&pDVar18->prev)[*(uint *)&pDVar37->next];
                          pDVar16 = pDVar37[1].prev;
                          if (pDVar14[5].prev <= pDVar16) goto LAB_001145a2;
                          pDVar6 = pDVar14[1].prev;
                          pDVar18 = (DynamicBlock *)((long)&pDVar16->prev + (long)pDVar6);
                          zone.constant._1_7_ = (undefined7)((ulong)zone >> 8);
                          zone.constant._0_1_ = CARRY8((ulong)pDVar6,(ulong)pDVar16) || bVar38;
                          pSVar22 = (Slot *)0x31;
                          pSVar23 = pSVar22;
                          if (!CARRY8((ulong)pDVar6,(ulong)pDVar16) && !bVar38) {
                            zone.constant._1_7_ = 0;
                            zone.constant._0_1_ = *(byte *)((long)&pDVar37[2].prev + 3);
                            if ((Section *)((long)pDVar14[5].prev - (long)pDVar16) < zone.constant)
                            goto LAB_001145a7;
                            zone.expression =
                                 (Expression *)
                                 ((long)pDStack_c8 +
                                 ((long)&(pDVar37[1].next)->prev - (long)pDVar18));
                            pDVar16 = (DynamicBlock *)((long)&pDVar16->prev + (long)pDVar14[4].next)
                            ;
                            pSStack_e0 = (Slot *)0x11453d;
                            bVar9 = CodeWriterUtils::writeOffset
                                              (pDVar16,zone.constant,(OffsetFormat *)(pDVar37 + 2));
                            if (!bVar9) goto LAB_00114563;
                            pDVar14 = pDVar37->prev;
                            pDVar33->prev = pDVar14;
                            pDVar15[0x11].next =
                                 (DynamicBlock *)((long)&pDVar15[0x11].next[-1].next + 7);
                            if (pDVar15[4].prev != (DynamicBlock *)0x0) {
                              pDVar18 = pDVar15[5].prev;
                              pDVar37->prev = pDVar18;
                              pDVar15[5].prev = pDVar37;
                              goto LAB_0011456c;
                            }
                            goto LAB_001145ac;
                          }
LAB_00114563:
                          pDVar14 = pDVar37->prev;
                          pSVar22 = pSVar23;
                          pDVar33 = pDVar37;
                          pSVar35 = pSVar23;
LAB_0011456c:
                          pDVar37 = pDVar14;
                        } while (pDVar14 != (DynamicBlock *)0x0);
                      }
                      pDStack_d0 = (DynamicBlock *)&pDStack_d0->next;
                    } while (pDStack_d0 != (DynamicBlock *)ppDStack_d8);
                  }
                  return (Error)pSVar35;
                }
              }
              EVar11 = 1;
            }
          }
          else {
            EVar11 = 0x10;
          }
          return EVar11;
        }
      }
      EVar11 = 1;
    }
  }
  return EVar11;
LAB_0011464e:
  pDVar33 = pDVar15;
  uVar30 = *(uint *)((long)&pDVar33->next + 4);
  if ((ulong)uVar30 != 0xffffffff) {
    if (uVar30 < *(uint *)&pDVar16[0xe].next) {
      pDVar14 = (&(pDVar16[0xe].prev)->prev)[uVar30];
      pDVar15 = pDVar14 + 2;
      pDVar15->prev = (DynamicBlock *)((long)&pDVar18->prev + (long)pDVar15->prev);
      *(uint *)((long)&pDVar14[1].prev + 4) = extraout_EDX;
LAB_00114676:
      pDVar15 = pDVar33->prev;
      pDVar37->prev = pDVar15;
      pDVar16[0x11].next = (DynamicBlock *)((long)&pDVar16[0x11].next[-1].next + 7);
      if (pDVar16[4].prev != (DynamicBlock *)0x0) {
        pDVar33->prev = pDVar16[5].prev;
        pDVar16[5].prev = pDVar33;
        pDVar33 = pDVar37;
        goto LAB_001146f4;
      }
      uStack_128 = 0x114725;
      bindLabel();
    }
    uStack_128 = 0x11472a;
    bindLabel();
LAB_0011472a:
    uStack_128 = 0x11472f;
    bindLabel();
LAB_0011472f:
    uStack_128 = 0x114734;
    bindLabel();
    return 0x14;
  }
  if (*(uint *)&pDVar33->next == extraout_EDX) {
    pDVar15 = pDVar33[1].prev;
    if (pDStack_110[5].prev <= pDVar15) goto LAB_0011472a;
    if ((ulong)((long)pDStack_110[5].prev - (long)pDVar15) <
        (ulong)*(byte *)((long)&pDVar33[2].prev + 2)) goto LAB_0011472f;
    uStack_128 = 0x1146de;
    bVar38 = CodeWriterUtils::writeOffset
                       ((void *)((long)&(pDStack_110[4].next)->prev + (long)&pDVar15->prev),
                        ((long)pDVar18 - (long)pDVar15) + (long)pDVar33[1].next,
                        (OffsetFormat *)(pDVar33 + 2));
    if (bVar38) goto LAB_00114676;
    pDVar15 = pDVar33->prev;
    EStack_114 = 0x31;
  }
  else {
    pDVar15 = pDVar33->prev;
  }
LAB_001146f4:
  pDVar37 = pDVar33;
  if (pDVar15 == (DynamicBlock *)0x0) {
    return EStack_114;
  }
  goto LAB_0011464e;
LAB_00114839:
  lVar31 = *(long *)((long)&((ZoneAllocator *)(VVar28.constant + 0xc0))->_zone->_ptr + lVar20);
  uVar17 = *(ulong *)(lVar31 + 0x50);
  if (*(ulong *)(lVar31 + 0x50) < *(ulong *)(lVar31 + 0x18)) {
    uVar17 = *(ulong *)(lVar31 + 0x18);
  }
  if (uVar17 != 0) {
    pCVar32 = (CodeHolder *)
              (-(ulong)*(uint *)(lVar31 + 8) &
              (long)(self->_allocator)._slots + ((ulong)*(uint *)(lVar31 + 8) - 0x49));
    if (pCVar32 < self) {
      uStack_168 = 0x114893;
      codeSize();
      if ((ZoneAllocator *)VVar27.constant == (ZoneAllocator *)0xffffffffffffffff) {
        return 2;
      }
      self->_baseAddress = (uint64_t)VVar27;
      bVar2 = (self->_environment)._arch;
      VVar7 = (Value)self->_addressTableSection;
      pSVar22 = (Slot *)0x0;
      VVar28 = VVar27;
      pCVar32 = self;
      VStack_190 = zone;
      VStack_188 = VVar34;
      pSStack_180 = pSVar35;
      pDStack_178 = pDVar15;
      VStack_170.expression = allocator_01.expression;
      uStack_168 = uVar24;
      if ((Section *)VVar7.constant == (Section *)0x0) {
        pSStack_1b8 = (Slot *)0x0;
      }
      else {
        VVar34.expression = (Expression *)(VVar7.constant + 0x48);
        if (((anon_union_8_2_185e79b9_for_Zone_4 *)(VVar7.constant + 0x58))->_packedData <
            ((anon_union_8_2_185e79b9_for_Zone_4 *)&(VVar7.label)->_offset)->_packedData) {
          if (((ulong)((Zone *)(VVar7.constant + 0x60))->_ptr & 2) != 0) {
            return 9;
          }
          pSStack_1e0 = (Slot *)0x1148f6;
          VVar28.expression = VVar34.expression;
          EVar11 = CodeHolder_reserveInternal
                             (self,(CodeBuffer *)VVar34.expression,
                              ((anon_union_8_2_185e79b9_for_Zone_4 *)&(VVar7.label)->_offset)->
                              _packedData);
          zone = VVar7;
          allocator_01 = VVar27;
          if (EVar11 != 0) {
            return EVar11;
          }
        }
        pSStack_1b8 = *(Slot **)VVar34.expression;
      }
      uVar17 = (ulong)(self->_relocations).super_ZoneVectorBase._size;
      if (uVar17 == 0) goto LAB_00114bc0;
      VVar34 = (Value)(self->_relocations).super_ZoneVectorBase._data;
      pVStack_198 = (Value *)((VVar34.expression)->valueType + uVar17 * 8 + -1);
      pSStack_1b0 = (Slot *)((ulong)(bVar2 & 1) ^ 3);
      pSVar22 = (Slot *)0x0;
      pCStack_1a8 = self;
      goto LAB_00114950;
    }
    self = (CodeHolder *)((long)(pCVar32->_allocator)._slots + (uVar17 - 0x48));
    VVar27._0_1_ = (byte)VVar27.constant | CARRY8((ulong)pCVar32,uVar17);
    VVar27.constant._1_7_ = 0;
  }
  lVar20 = lVar20 + 8;
  if ((ulong)*(uint *)(VVar28.constant + 200) << 3 == lVar20) {
    return -(uint)((char)VVar27.constant != '\0') | (uint)self;
  }
  goto LAB_00114839;
LAB_00114950:
  allocator_01.constant = *VVar34.constant;
  iVar12 = *(int *)((allocator_01.expression)->reserved + 1);
  if (iVar12 == 0) goto LAB_00114b34;
  uVar30 = (self->_sections).super_ZoneVectorBase._size;
  if (uVar30 <= *(uint *)((allocator_01.expression)->value + 1)) {
    pSStack_1e0 = (Slot *)0x114c13;
    relocateToBase();
    return 0x18;
  }
  pvVar29 = (self->_sections).super_ZoneVectorBase._data;
  lVar20 = *(long *)((long)pvVar29 + (ulong)*(uint *)((allocator_01.expression)->value + 1) * 8);
  uVar5 = (allocator_01.label)->_parentId;
  if ((ulong)uVar5 == 0xffffffff) {
    lVar31 = 0;
  }
  else {
    if (uVar30 <= uVar5) {
      pSStack_1e0 = (Slot *)0x114c22;
      relocateToBase();
      return 2;
    }
    lVar31 = *(long *)((long)pvVar29 + (ulong)uVar5 * 8);
  }
  pCVar32 = (CodeHolder *)(allocator_01.label)->_section;
  uVar17 = (allocator_01.label)->_offset;
  if (*(ulong *)(lVar20 + 0x50) <= uVar17) {
    return 0x18;
  }
  EStack_1c4 = 0x18;
  out = (uint64_t *)(ulong)*(byte *)((long)(allocator_01.expression)->value + 2);
  if ((uint64_t *)(*(ulong *)(lVar20 + 0x50) - uVar17) < out) {
    return 0x18;
  }
  if (4 < iVar12 - 1U) {
    return 0x18;
  }
  VVar28 = (Value)((Value *)(lVar20 + 0x10))->expression;
  pSStack_1c0 = *(Slot **)(lVar20 + 0x48);
  zone.expression = (Expression *)(uVar17 + *(byte *)((long)(allocator_01.expression)->value + 4));
  pCStack_1d0 = pCVar32;
  switch(iVar12) {
  case 1:
    VVar28.expression = (Expression *)&pCStack_1d0;
    pSStack_1e0 = (Slot *)0x114a15;
    pSStack_1a0 = pSVar22;
    EVar11 = CodeHolder_evaluateExpression(pCVar32,VVar28.expression,out);
    pSVar22 = pSStack_1a0;
    self = pCStack_1a8;
    if (EVar11 != 0) {
      return EVar11;
    }
    break;
  case 2:
    goto switchD_001149fb_caseD_2;
  case 3:
    if (lVar31 == 0) {
      return 0x18;
    }
    pCVar32 = (CodeHolder *)
              ((long)(pCVar32->_allocator)._slots +
              (long)(VVar27.expression[-3].valueType + *(long *)(lVar31 + 0x10) + -1));
    pCStack_1d0 = pCVar32;
    goto switchD_001149fb_caseD_2;
  case 4:
    VVar28.expression = (Expression *)((VVar28.expression)->valueType + (long)(VVar27.constant - 1))
    ;
    pCStack_1d0 = (CodeHolder *)
                  ((long)pCVar32 -
                  (long)((long)out + (long)((VVar28.expression)->valueType + (uVar17 - 1))));
    pCVar32 = pCStack_1d0;
    if ((bVar2 & 1) != 0) goto switchD_001149fb_caseD_2;
    pCVar32 = (CodeHolder *)((ulong)&pCStack_1d0[0x6bca1a]._addressTableSection >> 0x20);
    if (pCVar32 != (CodeHolder *)0x0) {
      return 0x19;
    }
    break;
  case 5:
    if (zone.constant < (Section *)0x2) {
      return 0x18;
    }
    if (*(char *)((long)(allocator_01.expression)->value + 3) != '\x04') {
      return 0x18;
    }
    pCStack_1d0 = (CodeHolder *)
                  ((long)pCVar32 -
                  (long)((long)out +
                        (long)((VVar27.expression)->valueType +
                              (long)((VVar28.expression)->valueType + (uVar17 - 2)))));
    if ((CodeHolder *)(long)(int)pCStack_1d0 == pCStack_1d0) goto switchD_001149fb_caseD_2;
    pAVar19 = (self->_addressTableEntries)._root;
    while( true ) {
      if (pAVar19 == (AddressTableEntry *)0x0) {
        return 0x18;
      }
      pCVar8 = (CodeHolder *)pAVar19->_address;
      uVar30 = (uint)(pCVar8 >= pCVar32 && pCVar8 != pCVar32) - (uint)(pCVar8 < pCVar32);
      if (uVar30 == 0) break;
      pAVar19 = (AddressTableEntry *)
                ((pAVar19->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData[uVar30 >> 0x1f] & 0xfffffffffffffffe);
    }
    if ((Section *)VVar7.constant == (Section *)0x0) goto LAB_00114c2e;
    uVar30 = pAVar19->_slot;
    if (uVar30 == 0xffffffff) {
      uVar30 = (uint)pSVar22;
      pAVar19->_slot = uVar30;
      pSVar22 = (Slot *)(ulong)(uVar30 + 1);
    }
    pCVar32 = (CodeHolder *)((ulong)uVar30 << ((byte)pSStack_1b0 & 0x3f));
    pCStack_1d0 = (CodeHolder *)
                  (((long)(VVar7.expression)->value[1].expression -
                   (long)((VVar28.expression)->valueType + (uVar17 - 1) + (long)out)) +
                  (long)pCVar32);
    if ((CodeHolder *)(long)(int)pCStack_1d0 != pCStack_1d0) {
      return 0x19;
    }
    cVar3 = ((undefined1 *)((long)&pSStack_1c0[-1].next + 7))[(long)zone.expression];
    uVar10 = 0x15;
    if (cVar3 != -0x18) {
      if (cVar3 != -0x17) {
        return 0x18;
      }
      uVar10 = 0x25;
    }
    ((undefined1 *)((long)&pSStack_1c0[-1].next + 6))[(long)zone.expression] = 0xff;
    ((undefined1 *)((long)&pSStack_1c0[-1].next + 7))[(long)zone.expression] = uVar10;
    *(Section **)((long)(pCVar32->_allocator)._slots + (long)(pSStack_1b8 + -8 + -1)) =
         (allocator_01.label)->_section;
  }
LAB_00114aee:
  switch(*(undefined1 *)((long)(allocator_01.expression)->value + 3)) {
  case 1:
    *(undefined1 *)((long)&pSStack_1c0->next + (long)zone.expression) = pCStack_1d0._0_1_;
    break;
  case 2:
    *(undefined2 *)((long)&pSStack_1c0->next + (long)zone.expression) = pCStack_1d0._0_2_;
    break;
  default:
    return EStack_1c4;
  case 4:
    *(undefined4 *)((long)&pSStack_1c0->next + (long)zone.expression) = pCStack_1d0._0_4_;
    break;
  case 8:
    *(CodeHolder **)((long)&pSStack_1c0->next + (long)zone.expression) = pCStack_1d0;
  }
LAB_00114b34:
  VVar34.expression = (Expression *)(VVar34.expression)->value;
  if ((Value *)VVar34.constant == pVStack_198) goto LAB_00114bc0;
  goto LAB_00114950;
switchD_001149fb_caseD_2:
  goto LAB_00114aee;
LAB_00114bc0:
  sVar4 = (self->_sectionsByOrder).super_ZoneVectorBase._size;
  if (sVar4 != 0) {
    if (*(Section **)
         ((long)(self->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)(sVar4 - 1) * 8) ==
        (Section *)VVar7.constant) {
      aVar25._0_4_ = (int)pSVar22 << (bVar2 & 1 ^ 3);
      aVar25._packedData._4_4_ = 0;
      *(anon_union_8_2_185e79b9_for_Zone_4 *)(VVar7.constant + 0x50) = aVar25;
      *(anon_union_8_2_185e79b9_for_Zone_4 *)&(VVar7.label)->_offset = aVar25;
    }
    return 0;
  }
  pSStack_1e0 = (Slot *)0x114c2e;
  relocateToBase();
LAB_00114c2e:
  pSStack_1e0 = (Slot *)CodeHolder_evaluateExpression;
  relocateToBase();
  lVar20 = 0;
  puVar36 = auStack_230;
  bVar38 = true;
  VStack_220 = VVar28;
  VStack_208 = zone;
  VStack_200 = VVar34;
  uStack_1f8 = (ulong)bVar2;
  pCStack_1f0 = self;
  VStack_1e8 = allocator_01;
  pSStack_1e0 = pSVar22;
  do {
    bVar9 = bVar38;
    pSVar22 = (Slot *)(ulong)*(byte *)((long)(pCVar32->_allocator)._slots + lVar20 + -0x47);
    if ((Slot *)0x3 < pSVar22) {
      return 3;
    }
    switch(pSVar22) {
    case (Slot *)0x1:
      pSVar22 = (pCVar32->_allocator)._slots[lVar20 + -8];
      break;
    case (Slot *)0x2:
      pSVar22 = (pCVar32->_allocator)._slots[lVar20 + -8];
      pSVar35 = pSVar22[4].next;
      if (pSVar35 == (Slot *)0x0) {
        return 0x43;
      }
      pSVar22 = (Slot *)((long)&(pSVar35[2].next)->next + (long)&(pSVar22[3].next)->next);
      break;
    case (Slot *)0x3:
      EVar11 = CodeHolder_evaluateExpression
                         ((CodeHolder *)(pCVar32->_allocator)._slots[lVar20 + -8],
                          (Expression *)&pSStack_210,
                          (uint64_t *)
                          ((long)&switchD_00114c75::switchdataD_00136004 +
                          (long)(int)(&switchD_00114c75::switchdataD_00136004)[(long)pSVar22]));
      pSVar22 = pSStack_210;
      if (EVar11 != 0) {
        return EVar11;
      }
    }
    *puVar36 = (ulong)pSVar22;
    lVar20 = 1;
    puVar36 = &uStack_218;
    bVar38 = false;
  } while (bVar9);
  switch((pCVar32->_environment)._arch) {
  case '\0':
    uVar17 = uStack_218 + auStack_230[0];
    break;
  case '\x01':
    uVar17 = auStack_230[0] - uStack_218;
    break;
  case '\x02':
    uVar17 = uStack_218 * auStack_230[0];
    break;
  case '\x03':
    auStack_230[0] = auStack_230[0] << ((byte)uStack_218 & 0x3f);
    goto LAB_00114d20;
  case '\x04':
    auStack_230[0] = auStack_230[0] >> ((byte)uStack_218 & 0x3f);
LAB_00114d20:
    uVar17 = 0;
    if (uStack_218 < 0x40) {
      uVar17 = auStack_230[0];
    }
    break;
  case '\x05':
    uVar17 = 0x3f;
    if (uStack_218 < 0x3f) {
      uVar17 = uStack_218;
    }
    uVar17 = (long)auStack_230[0] >> ((byte)uVar17 & 0x3f);
    break;
  default:
    return 3;
  }
  (VStack_220.expression)->opType = (char)uVar17;
  (VStack_220.expression)->valueType[0] = (char)(uVar17 >> 8);
  (VStack_220.expression)->valueType[1] = (char)(uVar17 >> 0x10);
  (VStack_220.expression)->reserved[0] = (char)(uVar17 >> 0x18);
  (VStack_220.expression)->reserved[1] = (char)(uVar17 >> 0x20);
  (VStack_220.expression)->reserved[2] = (char)(uVar17 >> 0x28);
  (VStack_220.expression)->reserved[3] = (char)(uVar17 >> 0x30);
  (VStack_220.expression)->reserved[4] = (char)(uVar17 >> 0x38);
  return 0;
}

Assistant:

Error CodeHolder::newLabelEntry(LabelEntry** entryOut) noexcept {
  *entryOut = nullptr;

  uint32_t labelId = _labelEntries.size();
  if (ASMJIT_UNLIKELY(labelId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyLabels);

  ASMJIT_PROPAGATE(_labelEntries.willGrow(&_allocator));
  LabelEntry* le = _allocator.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorOutOfMemory);

  le->_setId(labelId);
  le->_parentId = Globals::kInvalidId;
  le->_offset = 0;
  _labelEntries.appendUnsafe(le);

  *entryOut = le;
  return kErrorOk;
}